

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

ostream * util::math::internal_vector::operator<<(ostream *out,D *v)

{
  size_t sVar1;
  int i;
  int b;
  char *__s;
  double dVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  b = 0;
  __s = "";
  do {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar1);
    dVar2 = BasicVector<Vector2,_double,_2UL>::operator[]((BasicVector<Vector2,_double,_2UL> *)v,b);
    std::ostream::_M_insert<double>(dVar2);
    b = b + 1;
    __s = ", ";
  } while (b == 1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const D& v) {
    out << "[";
    const char *sep = "";
    for (int i = 0; i < SIZE; ++i) {
      out << sep;
      Print(out, v[i]);
      sep = ", ";
    }
    return out << "]";
  }